

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tria_o1.cc
# Opt level: O0

void __thiscall lf::geometry::TriaO1::TriaO1(TriaO1 *this,Matrix<double,__1,_3,_0,__1,_3> *coords)

{
  Index IVar1;
  Matrix<double,__1,_2,_0,__1,_2> *this_00;
  double extraout_XMM0_Qa;
  Scalar __x;
  double dVar2;
  non_const_type local_2b8;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
  local_2b0;
  non_const_type local_2a0;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>
  local_298;
  XprTypeNested local_288;
  Product<Eigen::Matrix<double,__1,_2,_0,__1,_2>,_Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>,_0>
  local_278;
  Matrix<double,__1,__1,_0,__1,__1> local_260;
  non_const_type local_248;
  XprTypeNested local_240;
  ColXpr local_238;
  ColXpr local_200;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_1c8;
  ColXpr local_150;
  ColXpr local_118;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>
  local_e0;
  CommaInitializer<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> local_68;
  int local_44;
  Index local_40 [3];
  int local_24;
  Index local_20;
  Matrix<double,__1,_3,_0,__1,_3> *local_18;
  Matrix<double,__1,_3,_0,__1,_3> *coords_local;
  TriaO1 *this_local;
  
  local_18 = coords;
  coords_local = (Matrix<double,__1,_3,_0,__1,_3> *)this;
  Geometry::Geometry(&this->super_Geometry);
  (this->super_Geometry)._vptr_Geometry = (_func_int **)&PTR_DimLocal_00990c68;
  Eigen::Matrix<double,_-1,_3,_0,_-1,_3>::Matrix(&this->coords_,coords);
  local_20 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::rows
                       (&(this->coords_).
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>);
  local_24 = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_,&local_20,&local_24);
  local_40[0] = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::rows
                          (&(this->coords_).
                            super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>);
  local_44 = 2;
  Eigen::Matrix<double,-1,2,0,-1,2>::Matrix<long,int>
            ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_inverse_gramian_,local_40,&local_44);
  this->integrationElement_ = 0.0;
  assertNonDegenerateTriangle(&this->coords_,1e-08);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_118,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,1);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_150,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>>::operator-
            (&local_e0,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>> *)&local_118,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_> *)
             &local_150);
  Eigen::DenseBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator<<
            (&local_68,(DenseBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->jacobian_,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
              *)&local_e0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_200,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,2);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::col
            (&local_238,(DenseBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_> *)&this->coords_,0);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,3,0,-1,3>,-1,1,true>>::operator-
            (&local_1c8,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,3,0,_1,3>,_1,1,true>> *)&local_200,
             (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_> *)
             &local_238);
  Eigen::CommaInitializer<Eigen::Matrix<double,-1,2,0,-1,2>>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_1,2,0,_1,2>> *)&local_68,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>,_const_Eigen::Block<Eigen::Matrix<double,__1,_3,_0,__1,_3>,__1,_1,_true>_>_>
              *)&local_1c8);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::~CommaInitializer(&local_68);
  IVar1 = Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_3,_0,_-1,_3>_>::rows
                    (&(this->coords_).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_0,__1,_3>_>
                    );
  if (IVar1 == 2) {
    local_248 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->jacobian_);
    local_240.m_matrix =
         (non_const_type)
         Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>_>::inverse
                   ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_> *)
                    &local_248);
    Eigen::Matrix<double,-1,2,0,-1,2>::operator=
              ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_inverse_gramian_,
               (DenseBase<Eigen::Inverse<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>_>_>
                *)&local_240);
    this_00 = &this->jacobian_;
    Eigen::MatrixBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::determinant
              ((MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)this_00);
    std::abs((int)this_00);
    this->integrationElement_ = extraout_XMM0_Qa;
  }
  else {
    local_2a0 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->jacobian_);
    local_298 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,2,0,-1,2>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,2,0,_1,2>>> *)
                           &local_2a0,
                           (MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->jacobian_);
    local_288 = (XprTypeNested)
                Eigen::
                MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>_>
                ::inverse((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>
                           *)&local_298);
    Eigen::MatrixBase<Eigen::Matrix<double,-1,2,0,-1,2>>::operator*
              (&local_278,(MatrixBase<Eigen::Matrix<double,_1,2,0,_1,2>> *)&this->jacobian_,
               (MatrixBase<Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>_>
                *)&local_288);
    Eigen::Matrix<double,-1,-1,0,-1,-1>::
    Matrix<Eigen::Product<Eigen::Matrix<double,_1,2,0,_1,2>,Eigen::Inverse<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,2,0,_1,2>>,Eigen::Matrix<double,_1,2,0,_1,2>,0>>,0>>
              ((Matrix<double,_1,_1,0,_1,_1> *)&local_260,&local_278);
    Eigen::Matrix<double,-1,2,0,-1,2>::operator=
              ((Matrix<double,_1,2,0,_1,2> *)&this->jacobian_inverse_gramian_,
               (DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_260);
    Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>::~Matrix(&local_260);
    local_2b8 = (non_const_type)
                Eigen::DenseBase<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>::transpose
                          ((DenseBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->jacobian_);
    local_2b0 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,2,0,-1,2>>>::operator*
                          ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,2,0,_1,2>>> *)
                           &local_2b8,
                           (MatrixBase<Eigen::Matrix<double,__1,_2,_0,__1,_2>_> *)&this->jacobian_);
    __x = Eigen::
          MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_2,_0,_-1,_2>_>,_Eigen::Matrix<double,_-1,_2,_0,_-1,_2>,_0>_>
          ::determinant((MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,_2,_0,__1,_2>_>,_Eigen::Matrix<double,__1,_2,_0,__1,_2>,_0>_>
                         *)&local_2b0);
    dVar2 = sqrt(__x);
    this->integrationElement_ = dVar2;
  }
  return;
}

Assistant:

TriaO1::TriaO1(Eigen::Matrix<double, Eigen::Dynamic, 3> coords)
    : coords_(std::move(coords)),
      jacobian_(coords_.rows(), 2),
      jacobian_inverse_gramian_(coords_.rows(), 2) {
  // Make sure that the triangle has a proper shape.
  assertNonDegenerateTriangle(coords_);
  // Precompute constant Jacobian
  jacobian_ << coords_.col(1) - coords_.col(0), coords_.col(2) - coords_.col(0);
  // Precompute constant metric factor
  if (coords_.rows() == 2) {
    jacobian_inverse_gramian_ = jacobian_.transpose().inverse();
    integrationElement_ = std::abs(jacobian_.determinant());
  } else {
    jacobian_inverse_gramian_ = Eigen::MatrixXd(
        jacobian_ * (jacobian_.transpose() * jacobian_).inverse());
    integrationElement_ =
        std::sqrt((jacobian_.transpose() * jacobian_).determinant());
  }
}